

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getIntFromStmt(sqlite3 *db,char *zSql,int *piVal)

{
  int iVar1;
  sqlite3_stmt *local_30;
  sqlite3_stmt *pStmt;
  int *piStack_20;
  int rc;
  int *piVal_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  pStmt._4_4_ = 7;
  if (zSql != (char *)0x0) {
    local_30 = (sqlite3_stmt *)0x0;
    piStack_20 = piVal;
    piVal_local = (int *)zSql;
    zSql_local = (char *)db;
    pStmt._4_4_ = sqlite3_prepare_v2(db,zSql,-1,&local_30,(char **)0x0);
    if (pStmt._4_4_ == 0) {
      iVar1 = sqlite3_step(local_30);
      if (iVar1 == 100) {
        iVar1 = sqlite3_column_int(local_30,0);
        *piStack_20 = iVar1;
      }
      pStmt._4_4_ = sqlite3_finalize(local_30);
    }
  }
  return pStmt._4_4_;
}

Assistant:

static int getIntFromStmt(sqlite3 *db, const char *zSql, int *piVal){
  int rc = SQLITE_NOMEM;
  if( zSql ){
    sqlite3_stmt *pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pStmt) ){
        *piVal = sqlite3_column_int(pStmt, 0);
      }
      rc = sqlite3_finalize(pStmt);
    }
  }
  return rc;
}